

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

X * __thiscall IMLE<1,_1,_FastLinearExpert>::predict(IMLE<1,_1,_FastLinearExpert> *this,Z *z)

{
  Scalar *pSVar1;
  reference pFVar2;
  value_type_conflict *__x;
  reference pMVar3;
  long in_RDI;
  X sumInvRxj;
  X sumInvRj;
  int j_1;
  int j;
  Scal sum_p;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffffdb8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffdc0;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffdc8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffdd0;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffdd8;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffde0;
  value_type __x_00;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffde8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffe00;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffe08;
  Z *in_stack_fffffffffffffef8;
  LinearExpert<1,_1> *in_stack_ffffffffffffff00;
  undefined4 local_34;
  undefined4 local_1c;
  
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *)0x275660);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *)0x275671);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x275682);
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0xb0); local_1c = local_1c + 1) {
    std::
    vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>::
    operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                *)(in_RDI + 0x98),(long)local_1c);
    LinearExpert<1,_1>::queryZ(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffdd0,
             (Index)in_stack_fffffffffffffdc8,(Scalar *)in_stack_fffffffffffffdc0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffdd0,
             (Index)in_stack_fffffffffffffdc8,(Scalar *)in_stack_fffffffffffffdc0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  *(Scalar *)(in_RDI + 0x188) = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  if ((*pSVar1 != 0.0) || (NAN(*pSVar1))) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffdc0
               ,(Index)in_stack_fffffffffffffdb8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               in_stack_fffffffffffffde0,(Index)in_stack_fffffffffffffdd8,
               (Index)in_stack_fffffffffffffdd0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               in_stack_fffffffffffffde0,(Index)in_stack_fffffffffffffdd8,
               (Index)in_stack_fffffffffffffdd0);
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0xb0); local_34 = local_34 + 1) {
      pFVar2 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_34);
      in_stack_fffffffffffffdd0 =
           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           LinearExpert<1,_1>::getGamma(&pFVar2->super_LinearExpert<1,_1>);
      pFVar2 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_34);
      in_stack_fffffffffffffdd8 =
           (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
           LinearExpert<1,_1>::get_p_z(&pFVar2->super_LinearExpert<1,_1>);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffde0 =
           (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
           ((double)in_stack_fffffffffffffdd0 * (double)in_stack_fffffffffffffdd8 + *pSVar1);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
      *pSVar1 = (Scalar)in_stack_fffffffffffffde0;
      pFVar2 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_34);
      in_stack_fffffffffffffdf0 =
           (vector<int,_std::allocator<int>_> *)
           LinearExpert<1,_1>::getPredXInvVar(&pFVar2->super_LinearExpert<1,_1>);
      pFVar2 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_34);
      in_stack_fffffffffffffde8 =
           (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
           LinearExpert<1,_1>::get_p_z(&pFVar2->super_LinearExpert<1,_1>);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
      Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffdd0,(Index)in_stack_fffffffffffffdc8);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                 in_stack_fffffffffffffdc0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                  *)in_stack_fffffffffffffdb8);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffdd0,(Index)in_stack_fffffffffffffdc8);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      asDiagonal((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffffdc0);
      pFVar2 = std::
               vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                             *)(in_RDI + 0x98),(long)local_34);
      LinearExpert<1,_1>::getPredX(&pFVar2->super_LinearExpert<1,_1>);
      Eigen::
      DiagonalBase<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
      ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                   *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffdd0,(Index)in_stack_fffffffffffffdc8);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                 in_stack_fffffffffffffdc0,
                 (DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                  *)in_stack_fffffffffffffdb8);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffdb8);
    Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::sum
              ((VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
               in_stack_fffffffffffffdd8);
    Eigen::Matrix<double,1,1,0,1,1>::
    Matrix<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffdc0,
               (EigenBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                *)in_stack_fffffffffffffdb8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffdb8);
    Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::sum
              ((VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
               in_stack_fffffffffffffdd8);
    Eigen::Matrix<double,1,1,0,1,1>::
    Matrix<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffdc0,
               (EigenBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                *)in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffdb8 =
         (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          *)(in_RDI + 0x1a8);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
    cwiseQuotient<Eigen::Matrix<double,1,1,0,1,1>>
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    __x_00 = (value_type)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    Eigen::Matrix<double,1,1,0,1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Matrix<double,1,1,0,1,1>const>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8)
    ;
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 *)in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdc0 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)(in_RDI + 0x1c0);
    Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::cwiseInverse
              (in_stack_fffffffffffffdd8);
    Eigen::Matrix<double,1,1,0,1,1>::
    Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffdc0,
               (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                *)in_stack_fffffffffffffdb8);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 *)in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8);
    __x = (value_type_conflict *)(in_RDI + 0x1d8);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
              (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0,__x);
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffdd0
               ,(Index)in_stack_fffffffffffffdc8,(Scalar *)in_stack_fffffffffffffdc0);
    __x_00 = (value_type)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               in_stack_fffffffffffffdd0,(Index)in_stack_fffffffffffffdc8,
               (Index)in_stack_fffffffffffffdc0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               in_stack_fffffffffffffdd0,(Index)in_stack_fffffffffffffdc8,
               (Index)in_stack_fffffffffffffdc0);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 *)in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 *)in_stack_fffffffffffffdd0,(value_type *)in_stack_fffffffffffffdc8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0,
               (value_type_conflict *)in_stack_fffffffffffffdc8);
  }
  *(undefined4 *)(in_RDI + 0x254) = 1;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x275c82);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffdf0,(size_type)in_stack_fffffffffffffde8,__x_00);
  *(undefined4 *)(in_RDI + 0x250) = 0;
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffdc0,
             (Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffdb8);
  *(undefined1 *)(in_RDI + 600) = 0;
  *(undefined1 *)(in_RDI + 0x259) = 0;
  pMVar3 = std::
           vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                         *)(in_RDI + 0x1a8),(long)*(int *)(in_RDI + 0x250));
  return pMVar3;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predict(Z const &z)
{

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d )
    {
        message("IMLE::predict: query dimension does not match input dimension!!");

        sum_p_z.setZero(1);
    }
    else
#endif
    {
        Scal sum_p = 0.0;
        for(int j = 0; j < M; j++)
            sum_p += experts[j].queryZ(z);
        sum_p_z.setConstant(1, sum_p);
        sumW.setConstant(1, sum_p + pNoiseModelZ);
        sumAll = sumW(0);
    }

    if(sum_p_z(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        varPhiAuxj.setConstant(M,pNoiseModelZ);
        fInvRj.setZero(D,M);
        invRxj.setZero(D,M);

        predictions.push_back(zeroX);
        predictionsVar.push_back(infinityX);
        predictionsWeight.push_back(0.0);
    }
    else
    {
        varPhiAuxj.resize(M);
        fInvRj.resize(D,M);
        invRxj.resize(D,M);
        for(int j = 0; j < M; j++)
        {
            varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW(0);
            fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
            invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();
        }

        // Update storage results
        X sumInvRj = fInvRj.rowwise().sum();
        X sumInvRxj = invRxj.rowwise().sum();

        predictions.push_back( sumInvRxj.cwiseQuotient(sumInvRj) );
        predictionsVar.push_back( sumInvRj.cwiseInverse() );
        predictionsWeight.push_back( sum_p_z(0) / sumAll );
    }

    nSolFound = 1;
    sNearest.clear();
    sNearest.resize(M,0);

    solIdx = 0;

    zQuery = z;
    hasPredJacobian = false;
    hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}